

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalGenerator::GenerateImportFile(cmGlobalGenerator *this,string *file)

{
  pointer puVar1;
  bool bVar2;
  iterator __position;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *m;
  pointer puVar3;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
               ::find(&(this->BuildExportSets)._M_t,file);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header) {
    bVar2 = false;
  }
  else {
    bVar2 = cmExportFileGenerator::GenerateImportFile
                      (*(cmExportFileGenerator **)(__position._M_node + 2));
    if (this->ConfigureDoneCMP0026AndCMP0024 == false) {
      puVar1 = (this->Makefiles).
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar3 = (this->Makefiles).
                    super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1
          ) {
        cmMakefile::RemoveExportBuildFileGeneratorCMP0024
                  ((puVar3->_M_t).
                   super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                   super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                   super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,
                   *(cmExportBuildFileGenerator **)(__position._M_node + 2));
      }
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmExportBuildFileGenerator*>>>
                        *)&this->BuildExportSets,__position);
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::GenerateImportFile(const std::string& file)
{
  auto const it = this->BuildExportSets.find(file);
  if (it != this->BuildExportSets.end()) {
    bool result = it->second->GenerateImportFile();

    if (!this->ConfigureDoneCMP0026AndCMP0024) {
      for (const auto& m : this->Makefiles) {
        m->RemoveExportBuildFileGeneratorCMP0024(it->second);
      }
    }

    this->BuildExportSets.erase(it);
    return result;
  }
  return false;
}